

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,128ul>>::
MatchAndExplain<pstore::small_vector<unsigned_char,128ul>>
          (ContainerEqMatcher<pstore::small_vector<unsigned_char,128ul>> *this,
          small_vector<unsigned_char,_128UL> *lhs,MatchResultListener *listener)

{
  ostream *os;
  bool bVar1;
  uchar *puVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  size_t sVar8;
  uchar *puVar9;
  char *pcVar10;
  
  sVar5 = lhs->elements_;
  puVar2 = lhs->buffer_;
  sVar3 = *(size_t *)this;
  if (sVar5 == sVar3) {
    bVar1 = true;
    if (sVar5 != 0) {
      sVar8 = 0;
      do {
        if (puVar2[sVar8] != *(uchar *)(*(long *)(this + 0xa0) + sVar8)) goto LAB_00135c79;
        sVar8 = sVar8 + 1;
      } while (sVar5 != sVar8);
    }
  }
  else {
LAB_00135c79:
    os = listener->stream_;
    if (os != (ostream *)0x0) {
      if (sVar5 == 0) {
        pcVar10 = "which";
      }
      else {
        bVar1 = false;
        puVar9 = puVar2;
        do {
          lVar4 = *(long *)this;
          if (lVar4 != 0) {
            lVar7 = 0;
            do {
              if (*(uchar *)(*(long *)(this + 0xa0) + lVar7) == *puVar9) {
                if (lVar4 != lVar7) goto LAB_00135d0c;
                break;
              }
              lVar7 = lVar7 + 1;
            } while (lVar4 != lVar7);
          }
          if (bVar1) {
            std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (os,"which has these unexpected elements: ",0x25);
            bVar1 = true;
          }
          PrintTo(*puVar9,os);
          sVar5 = lhs->elements_;
          puVar2 = lhs->buffer_;
LAB_00135d0c:
          puVar9 = puVar9 + 1;
        } while (puVar9 != puVar2 + sVar5);
        sVar3 = *(size_t *)this;
        pcVar10 = "which";
        if (bVar1) {
          pcVar10 = ",\nand";
        }
      }
      if (sVar3 != 0) {
        puVar2 = *(uchar **)(this + 0xa0);
        bVar1 = false;
        puVar9 = puVar2;
        do {
          sVar5 = lhs->elements_;
          if (sVar5 != 0) {
            sVar8 = 0;
            do {
              if (lhs->buffer_[sVar8] == *puVar9) {
                if (sVar5 != sVar8) goto LAB_00135dd0;
                break;
              }
              sVar8 = sVar8 + 1;
            } while (sVar5 != sVar8);
          }
          if (bVar1) {
            lVar4 = 2;
            pcVar6 = ", ";
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar10,5);
            lVar4 = 0x27;
            pcVar6 = " doesn\'t have these expected elements: ";
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,lVar4);
          PrintTo(*puVar9,os);
          sVar3 = *(size_t *)this;
          puVar2 = *(uchar **)(this + 0xa0);
          bVar1 = true;
LAB_00135dd0:
          puVar9 = puVar9 + 1;
        } while (puVar9 != puVar2 + sVar3);
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }